

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

String * __thiscall
kj::anon_unknown_0::NetworkAddressImpl::toString
          (String *__return_storage_ptr__,NetworkAddressImpl *this)

{
  size_t count;
  SocketAddress *pSVar1;
  String *delim;
  SocketAddress *this_00;
  ArrayBuilder<kj::String> builder;
  Array<char> local_58;
  Array<kj::String> local_38;
  
  count = (this->addrs).size_;
  builder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::String>(count);
  builder.endPtr = builder.ptr + count;
  builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pSVar1 = (this->addrs).ptr;
  builder.pos = builder.ptr;
  for (this_00 = pSVar1; delim = builder.ptr, this_00 != pSVar1 + (this->addrs).size_;
      this_00 = this_00 + 1) {
    SocketAddress::toString((String *)&local_58,this_00);
    ((builder.pos)->content).ptr = local_58.ptr;
    ((builder.pos)->content).size_ = local_58.size_;
    ((builder.pos)->content).disposer = local_58.disposer;
    local_58.ptr = (char *)0x0;
    local_58.size_ = 0;
    builder.pos = builder.pos + 1;
    Array<char>::~Array(&local_58);
    pSVar1 = (this->addrs).ptr;
  }
  local_38.size_ = ((long)builder.pos - (long)builder.ptr) / 0x18;
  local_38.ptr = builder.ptr;
  local_38.disposer = builder.disposer;
  builder.ptr = (String *)0x0;
  builder.pos = (RemoveConst<kj::String> *)0x0;
  builder.endPtr = (String *)0x0;
  ArrayBuilder<kj::String>::dispose(&builder);
  strArray<kj::Array<kj::String>>
            (__return_storage_ptr__,(kj *)&local_38,(Array<kj::String> *)0x426da0,(char *)delim);
  Array<kj::String>::~Array(&local_38);
  return __return_storage_ptr__;
}

Assistant:

String toString() override {
    return strArray(KJ_MAP(addr, addrs) { return addr.toString(); }, ",");
  }